

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O0

expr_node * __thiscall expr_tree::logDeriv(expr_tree *this,expr_node *node)

{
  expr_node *src;
  expr_node *_left;
  expr_node *_right;
  expr_node *deriv;
  expr_node *in_stack_000000a8;
  expr_tree *in_stack_000000b0;
  expr_value local_20;
  expr_node *local_18;
  
  src = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)&local_20,4);
  _left = derivative(in_stack_000000b0,in_stack_000000a8);
  _right = Copy(src);
  expr_node::expr_node(src,'\x05',&local_20,(expr_node *)0x0,_left,_right);
  local_18 = src;
  Link(src,src->left,src->right);
  return local_18;
}

Assistant:

expr_node* expr_tree::logDeriv(const expr_node* node)
{
    auto deriv = new expr_node(OP, (long)DIV, nullptr, derivative(node->right), Copy(node->right));
    Link(deriv, deriv->left, deriv->right);
    return deriv;
}